

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

int __thiscall tcmalloc::SizeMap::NumMoveSize(SizeMap *this,size_t size)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  
  if (size != 0) {
    auVar3._8_4_ = (int)(size >> 0x20);
    auVar3._0_8_ = size;
    auVar3._12_4_ = 0x45300000;
    iVar2 = (int)(65536.0 /
                 ((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)));
    iVar1 = 2;
    if (2 < iVar2) {
      iVar1 = iVar2;
    }
    if (FLAGS_tcmalloc_transfer_num_objects <= iVar1) {
      iVar1 = FLAGS_tcmalloc_transfer_num_objects;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int SizeMap::NumMoveSize(size_t size) {
  if (size == 0) return 0;
  // Use approx 64k transfers between thread and central caches.
  int num = static_cast<int>(64.0 * 1024.0 / size);
  if (num < 2) num = 2;

  // Avoid bringing too many objects into small object free lists.
  // If this value is too large:
  // - We waste memory with extra objects sitting in the thread caches.
  // - The central freelist holds its lock for too long while
  //   building a linked list of objects, slowing down the allocations
  //   of other threads.
  // If this value is too small:
  // - We go to the central freelist too often and we have to acquire
  //   its lock each time.
  // This value strikes a balance between the constraints above.
  if (num > FLAGS_tcmalloc_transfer_num_objects)
    num = FLAGS_tcmalloc_transfer_num_objects;

  return num;
}